

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

wstring * __thiscall
Centaurus::NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::get_exit_wide
          (wstring *__return_storage_ptr__,
          NFABase<Centaurus::NFABaseState<unsigned_char,_int>_> *this,wstring *prefix)

{
  size_type sVar1;
  wstring local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_40;
  wstring *local_20;
  wstring *prefix_local;
  NFABase<Centaurus::NFABaseState<unsigned_char,_int>_> *this_local;
  
  local_20 = prefix;
  prefix_local = (wstring *)this;
  this_local = (NFABase<Centaurus::NFABaseState<unsigned_char,_int>_> *)__return_storage_ptr__;
  std::operator+(&local_40,prefix,L"_S");
  sVar1 = std::
          vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
          ::size(&this->m_states);
  std::__cxx11::to_wstring(&local_60,sVar1 - 1);
  std::operator+(__return_storage_ptr__,&local_40,&local_60);
  std::__cxx11::wstring::~wstring((wstring *)&local_60);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::wstring get_exit_wide(const std::wstring& prefix) const
	{
		return prefix + L"_S" + std::to_wstring(m_states.size() - 1);
	}